

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O2

ConfidentialTransactionController * __thiscall
cfd::api::ElementsTransactionApi::AddRawTransaction
          (ConfidentialTransactionController *__return_storage_ptr__,ElementsTransactionApi *this,
          string *tx_hex,
          vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *txins,
          vector<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
          *pegins,vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *txouts,
          vector<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          *pegouts,ConfidentialTxOut *txout_fee,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *pegout_addresses)

{
  pointer pCVar1;
  pointer pTVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  pointer txid;
  ConfidentialTxInReference *this_00;
  pointer this_01;
  pointer this_02;
  pointer value;
  Amount AVar7;
  allocator local_a59;
  pointer local_a58;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *local_a50;
  ulong local_a48;
  string *local_a40;
  undefined1 local_a38 [24];
  undefined1 local_a20 [40];
  ConfidentialNonce local_9f8;
  Address pegout_address;
  Address dummy_addr;
  ConfidentialTxOutReference local_6d0;
  ConfidentialTxInReference local_5d8;
  ConfidentialTxOutReference local_478;
  ConfidentialTxOutReference local_380;
  ConfidentialTxOutReference local_288;
  ConfidentialTxInReference local_190;
  
  local_a58 = (pointer)pegins;
  local_a50 = txouts;
  ConfidentialTransactionController::ConfidentialTransactionController
            (__return_storage_ptr__,tx_hex);
  uVar4 = AbstractTransactionController::GetLockTimeDisabledSequence();
  pCVar1 = (txins->
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (txins->
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 )._M_impl.super__Vector_impl_data._M_start; this_01 != pCVar1;
      this_01 = this_01 + 1) {
    uVar5 = core::AbstractTxIn::GetSequence(&this_01->super_AbstractTxIn);
    if (uVar4 == uVar5) {
      core::AbstractTxIn::GetTxid((Txid *)&pegout_address,&this_01->super_AbstractTxIn);
      uVar5 = core::AbstractTxIn::GetVout(&this_01->super_AbstractTxIn);
      uVar6 = AbstractTransactionController::GetDefaultSequence
                        (&__return_storage_ptr__->super_AbstractTransactionController);
      ConfidentialTransactionController::AddTxIn
                (&local_5d8,__return_storage_ptr__,(Txid *)&pegout_address,uVar5,uVar6);
      this_00 = &local_5d8;
    }
    else {
      core::AbstractTxIn::GetTxid((Txid *)&pegout_address,&this_01->super_AbstractTxIn);
      uVar5 = core::AbstractTxIn::GetVout(&this_01->super_AbstractTxIn);
      uVar6 = core::AbstractTxIn::GetSequence(&this_01->super_AbstractTxIn);
      ConfidentialTransactionController::AddTxIn
                (&local_190,__return_storage_ptr__,(Txid *)&pegout_address,uVar5,uVar6);
      this_00 = &local_190;
    }
    core::ConfidentialTxInReference::~ConfidentialTxInReference(this_00);
    core::Txid::~Txid((Txid *)&pegout_address);
  }
  pTVar2 = (((_Vector_base<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
              *)&local_a58->amount)->_M_impl).super__Vector_impl_data._M_finish;
  for (txid = (((_Vector_base<cfd::api::TxInPeginParameters,_std::allocator<cfd::api::TxInPeginParameters>_>
                 *)&local_a58->amount)->_M_impl).super__Vector_impl_data._M_start; txid != pTVar2;
      txid = txid + 1) {
    ConfidentialTransactionController::AddPeginWitness
              (__return_storage_ptr__,&txid->txid,txid->vout,&txid->amount,&txid->asset,
               &txid->mainchain_blockhash,&txid->claim_script,&txid->mainchain_raw_tx,
               &txid->mainchain_txoutproof);
  }
  local_a58 = (pointer)(local_a50->
                       super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (local_a50->
                 super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                 )._M_impl.super__Vector_impl_data._M_start; (pointer)this_02 != local_a58;
      this_02 = this_02 + 1) {
    core::AbstractTxOut::GetLockingScript((Script *)&pegout_address,&this_02->super_AbstractTxOut);
    core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&dummy_addr,&this_02->confidential_value_);
    AVar7 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&dummy_addr);
    local_a38._0_8_ = AVar7.amount_;
    local_a38[8] = AVar7.ignore_check_;
    core::ConfidentialAssetId::ConfidentialAssetId
              ((ConfidentialAssetId *)local_a20,&this_02->asset_);
    core::ConfidentialNonce::ConfidentialNonce(&local_9f8,&this_02->nonce_);
    ConfidentialTransactionController::AddTxOut
              (&local_288,__return_storage_ptr__,(Script *)&pegout_address,(Amount *)local_a38,
               (ConfidentialAssetId *)local_a20,&local_9f8);
    core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_288);
    core::ConfidentialNonce::~ConfidentialNonce(&local_9f8);
    core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_a20);
    core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&dummy_addr);
    core::Script::~Script((Script *)&pegout_address);
  }
  value = (pegouts->
          super__Vector_base<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
          )._M_impl.super__Vector_impl_data._M_start;
  local_a58 = (pegouts->
              super__Vector_base<cfd::api::TxOutPegoutParameters,_std::allocator<cfd::api::TxOutPegoutParameters>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (value == local_a58) {
      core::ConfidentialValue::ConfidentialValue
                ((ConfidentialValue *)&pegout_address,&txout_fee->confidential_value_);
      AVar7 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&pegout_address);
      dummy_addr._0_8_ = AVar7.amount_;
      dummy_addr.witness_ver_._0_1_ = AVar7.ignore_check_;
      bVar3 = core::Amount::operator!=((Amount *)&dummy_addr,0);
      core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&pegout_address);
      if (bVar3) {
        core::ConfidentialValue::ConfidentialValue
                  ((ConfidentialValue *)&pegout_address,&txout_fee->confidential_value_);
        AVar7 = core::ConfidentialValue::GetAmount((ConfidentialValue *)&pegout_address);
        local_a20._0_8_ = AVar7.amount_;
        local_a20[8] = AVar7.ignore_check_;
        core::ConfidentialAssetId::ConfidentialAssetId
                  ((ConfidentialAssetId *)&dummy_addr,&txout_fee->asset_);
        ConfidentialTransactionController::AddTxOutFee
                  (&local_6d0,__return_storage_ptr__,(Amount *)local_a20,
                   (ConfidentialAssetId *)&dummy_addr);
        core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_6d0);
        core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&dummy_addr);
        core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&pegout_address);
      }
      return __return_storage_ptr__;
    }
    core::Address::Address(&pegout_address);
    bVar3 = core::Pubkey::IsValid(&value->online_pubkey);
    if (bVar3) {
      bVar3 = core::Privkey::IsInvalid((Privkey *)&value->master_online_key);
      if (bVar3) goto LAB_0035d320;
      core::Address::Address(&dummy_addr);
      local_a40 = &value->bitcoin_descriptor;
      local_a50 = (vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                   *)(ulong)(uint)value->net_type;
      local_a48 = (ulong)value->bip32_counter;
      ConfidentialTransactionController::AddPegoutTxOut
                (&local_380,__return_storage_ptr__,&value->amount,&value->asset,
                 &value->genesisblock_hash,&dummy_addr,value->net_type,&value->online_pubkey,
                 (Privkey *)&value->master_online_key,local_a40,value->bip32_counter,
                 &value->whitelist,value->elements_net_type,&pegout_address);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_380);
      core::Address::~Address(&dummy_addr);
    }
    else {
LAB_0035d320:
      core::Pubkey::Pubkey((Pubkey *)&local_9f8);
      core::Privkey::Privkey((Privkey *)&dummy_addr);
      std::__cxx11::string::string((string *)local_a20,"",&local_a59);
      core::ByteData::ByteData((ByteData *)local_a38);
      ConfidentialTransactionController::AddPegoutTxOut
                (&local_478,__return_storage_ptr__,&value->amount,&value->asset,
                 &value->genesisblock_hash,&value->btc_address,kMainnet,(Pubkey *)&local_9f8,
                 (Privkey *)&dummy_addr,(string *)local_a20,0,(ByteData *)local_a38,kLiquidV1,
                 (Address *)0x0);
      core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_478);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a38);
      std::__cxx11::string::~string((string *)local_a20);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dummy_addr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_9f8);
    }
    if (pegout_addresses !=
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x0) {
      core::Address::GetAddress_abi_cxx11_((string *)&dummy_addr,&pegout_address);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
      ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
                  *)pegout_addresses,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy_addr,
                 &value->amount);
      std::__cxx11::string::~string((string *)&dummy_addr);
    }
    core::Address::~Address(&pegout_address);
    value = value + 1;
  } while( true );
}

Assistant:

ConfidentialTransactionController ElementsTransactionApi::AddRawTransaction(
    const std::string& tx_hex, const std::vector<ConfidentialTxIn>& txins,
    const std::vector<TxInPeginParameters>& pegins,
    const std::vector<ConfidentialTxOut>& txouts,
    const std::vector<TxOutPegoutParameters>& pegouts,
    const ConfidentialTxOut& txout_fee,
    std::map<std::string, Amount>* pegout_addresses) const {
  ConfidentialTransactionController ctxc(tx_hex);

  const uint32_t kLockTimeDisabledSequence =
      ctxc.GetLockTimeDisabledSequence();
  for (const auto& txin : txins) {
    // Create TxIn's unlocking_script as empty.
    if (kLockTimeDisabledSequence == txin.GetSequence()) {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), ctxc.GetDefaultSequence());
    } else {
      ctxc.AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
    }
  }

  for (const auto& pegin_data : pegins) {
    ctxc.AddPeginWitness(
        pegin_data.txid, pegin_data.vout, pegin_data.amount, pegin_data.asset,
        pegin_data.mainchain_blockhash, pegin_data.claim_script,
        pegin_data.mainchain_raw_tx, pegin_data.mainchain_txoutproof);
  }

  for (const auto& txout : txouts) {
    ctxc.AddTxOut(
        txout.GetLockingScript(), txout.GetConfidentialValue().GetAmount(),
        txout.GetAsset(), txout.GetNonce());
  }

  for (const auto& pegout_data : pegouts) {
    Address pegout_address;
    if (pegout_data.online_pubkey.IsValid() &&
        !pegout_data.master_online_key.IsInvalid()) {
      Address dummy_addr;
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          dummy_addr, pegout_data.net_type, pegout_data.online_pubkey,
          pegout_data.master_online_key, pegout_data.bitcoin_descriptor,
          pegout_data.bip32_counter, pegout_data.whitelist,
          pegout_data.elements_net_type, &pegout_address);
    } else {
      ctxc.AddPegoutTxOut(
          pegout_data.amount, pegout_data.asset, pegout_data.genesisblock_hash,
          pegout_data.btc_address);
    }
    if (pegout_addresses != nullptr) {
      pegout_addresses->emplace(
          pegout_address.GetAddress(), pegout_data.amount);
    }
  }

  // A fee with an amount of 0 is considered invalid.
  if (txout_fee.GetConfidentialValue().GetAmount() != 0) {
    ctxc.AddTxOutFee(
        txout_fee.GetConfidentialValue().GetAmount(), txout_fee.GetAsset());
  }

  return ctxc;
}